

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O3

uint Dar_TruthPermute(uint Truth,char *pPerms,int nVars,int fReverse)

{
  undefined1 auVar1 [16];
  int *pMints;
  int *pMintsP;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  ulong uVar5;
  long lVar8;
  
  if (5 < nVars) {
    __assert_fail("nVars < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darPrec.c"
                  ,0xd6,"unsigned int Dar_TruthPermute(unsigned int, char *, int, int)");
  }
  uVar4 = 1 << ((byte)nVars & 0x1f);
  uVar5 = (ulong)uVar4;
  pMints = (int *)malloc(uVar5 * 4);
  pMintsP = (int *)malloc(uVar5 * 4);
  auVar1 = _DAT_0094e250;
  lVar8 = uVar5 - 1;
  auVar6._8_4_ = (int)lVar8;
  auVar6._0_8_ = lVar8;
  auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
  uVar2 = 0;
  auVar6 = auVar6 ^ _DAT_0094e250;
  auVar7 = _DAT_0094e240;
  do {
    auVar9 = auVar7 ^ auVar1;
    if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                auVar6._4_4_ < auVar9._4_4_) & 1)) {
      pMints[uVar2] = (int)uVar2;
    }
    if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
        auVar9._12_4_ <= auVar6._12_4_) {
      pMints[uVar2 + 1] = (int)uVar2 + 1;
    }
    uVar2 = uVar2 + 2;
    lVar8 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar8 + 2;
  } while ((uVar4 + 1 & 0xfffffffe) != uVar2);
  Dar_TruthPermute_int(pMints,uVar4,pPerms,nVars,pMintsP);
  if (fReverse == 0) {
    uVar2 = 0;
    uVar4 = 0;
    do {
      if ((Truth >> ((uint)uVar2 & 0x1f) & 1) != 0) {
        uVar4 = uVar4 | 1 << (*(byte *)(pMintsP + uVar2) & 0x1f);
      }
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  else {
    uVar2 = 0;
    uVar4 = 0;
    do {
      uVar3 = 1 << ((byte)uVar2 & 0x1f);
      if ((Truth >> (pMintsP[uVar2] & 0x1fU) & 1) == 0) {
        uVar3 = 0;
      }
      uVar4 = uVar4 | uVar3;
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
  }
  if (pMints != (int *)0x0) {
    free(pMints);
  }
  if (pMintsP != (int *)0x0) {
    free(pMintsP);
  }
  return uVar4;
}

Assistant:

unsigned Dar_TruthPermute( unsigned Truth, char * pPerms, int nVars, int fReverse )
{
    unsigned Result;
    int * pMints;
    int * pMintsP;
    int nMints;
    int i, m;

    assert( nVars < 6 );
    nMints  = (1 << nVars);
    pMints  = ABC_ALLOC( int, nMints );
    pMintsP = ABC_ALLOC( int, nMints );
    for ( i = 0; i < nMints; i++ )
        pMints[i] = i;

    Dar_TruthPermute_int( pMints, nMints, pPerms, nVars, pMintsP );

    Result = 0;
    if ( fReverse )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << pMintsP[m]) )
                Result |= (1 << m);
    }
    else
    {
        for ( m = 0; m < nMints; m++ )
            if ( Truth & (1 << m) )
                Result |= (1 << pMintsP[m]);
    }

    ABC_FREE( pMints );
    ABC_FREE( pMintsP );

    return Result;
}